

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

UINT8 __thiscall VGMPlayer::Stop(VGMPlayer *this)

{
  pointer pDVar1;
  pointer pDVar2;
  long lVar3;
  pointer pCVar4;
  PLAYER_EVENT_CB p_Var5;
  long lVar6;
  ulong uVar7;
  
  this->_playState = this->_playState & 0xfe;
  lVar6 = 0x10;
  uVar7 = 0;
  while( true ) {
    pDVar1 = (this->_dacStreams).
             super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (this->_dacStreams).
             super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pDVar2 - (long)pDVar1) / 0x38) <= uVar7) break;
    (**(code **)(*(long *)((long)&(pDVar1->defInf).dataPtr + lVar6) + 0x20))
              (*(undefined8 *)((long)pDVar1 + lVar6 + -0x10),pDVar2,
               ((long)pDVar2 - (long)pDVar1) % 0x38);
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x38;
  }
  if (pDVar2 != pDVar1) {
    (this->_dacStreams).
    super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
    super__Vector_impl_data._M_finish = pDVar1;
  }
  for (lVar6 = 0x57b8; lVar6 != 0x69b8; lVar6 = lVar6 + 0x48) {
    lVar3 = *(long *)((long)this + lVar6 + -0x20);
    if (*(long *)((long)this + lVar6 + -0x18) != lVar3) {
      *(long *)((long)this + lVar6 + -0x18) = lVar3;
    }
    lVar3 = *(long *)((long)this + lVar6 + -8);
    if (*(long *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar6) != lVar3) {
      *(long *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar6) = lVar3;
    }
    lVar3 = *(long *)((long)this + lVar6 + -0x38);
    if (*(long *)((long)this + lVar6 + -0x30) != lVar3) {
      *(long *)((long)this + lVar6 + -0x30) = lVar3;
    }
  }
  free((this->_pcmComprTbl).values.d8);
  (this->_pcmComprTbl).values.d8 = (UINT8 *)0x0;
  lVar6 = 0;
  for (uVar7 = 0;
      pCVar4 = (this->_devices).
               super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)(((long)(this->_devices).
                             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) / 0xf0);
      uVar7 = uVar7 + 1) {
    FreeDeviceTree((VGM_BASEDEV *)
                   ((long)(pCVar4->base).resmpl.smplBufs + lVar6 + 0xffffffffffffff90U),'\0');
    lVar6 = lVar6 + 0xf0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->_devNames);
  pCVar4 = (this->_devices).
           super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar4) {
    (this->_devices).
    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar4;
  }
  std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::clear
            (&this->_devCfgs);
  p_Var5 = (this->super_PlayerBase)._eventCbFunc;
  if (p_Var5 != (PLAYER_EVENT_CB)0x0) {
    (*p_Var5)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x02',(void *)0x0);
  }
  return '\0';
}

Assistant:

UINT8 VGMPlayer::Stop(void)
{
	size_t curDev;
	size_t curBank;
	
	_playState &= ~PLAYSTATE_PLAY;
	
	for (curDev = 0; curDev < _dacStreams.size(); curDev ++)
	{
		DEV_INFO* devInf = &_dacStreams[curDev].defInf;
		devInf->devDef->Stop(devInf->dataPtr);
	}
	_dacStreams.clear();
	
	for (curBank = 0x00; curBank < _PCM_BANK_COUNT; curBank ++)
	{
		PCM_BANK* pcmBnk = &_pcmBank[curBank];
		pcmBnk->bankOfs.clear();
		pcmBnk->bankSize.clear();
		pcmBnk->data.clear();
	}
	free(_pcmComprTbl.values.d8);	_pcmComprTbl.values.d8 = NULL;
	
	for (curDev = 0; curDev < _devices.size(); curDev ++)
		FreeDeviceTree(&_devices[curDev].base, 0);
	_devNames.clear();
	_devices.clear();
	_devCfgs.clear();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_STOP, NULL);
	
	return 0x00;
}